

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzpostprocanalysis.cpp
# Opt level: O1

void __thiscall
TPZPostProcAnalysis::SetCompMesh
          (TPZPostProcAnalysis *this,TPZCompMesh *pRef,bool mustOptimizeBandwidth)

{
  TPZGeoMesh *gr;
  TPZCompMesh *pTVar1;
  undefined7 in_register_00000011;
  
  if (this->fpMainMesh != pRef) {
    pTVar1 = (this->super_TPZLinearAnalysis).super_TPZAnalysis.fCompMesh;
    if (pTVar1 != (TPZCompMesh *)0x0) {
      (**(code **)(*(long *)pTVar1 + 8))
                (pTVar1,pRef,CONCAT71(in_register_00000011,mustOptimizeBandwidth));
      (this->super_TPZLinearAnalysis).super_TPZAnalysis.fCompMesh = (TPZCompMesh *)0x0;
      TPZAnalysis::CleanUp((TPZAnalysis *)this);
    }
    this->fpMainMesh = pRef;
    if (pRef != (TPZCompMesh *)0x0) {
      gr = pRef->fReference;
      pTVar1 = (TPZCompMesh *)operator_new(0x918);
      TPZCompMesh::TPZCompMesh(pTVar1,gr,false);
      (this->super_TPZLinearAnalysis).super_TPZAnalysis.fCompMesh = pTVar1;
      SetAllCreateFunctionsPostProc(pTVar1);
      return;
    }
  }
  return;
}

Assistant:

void TPZPostProcAnalysis::SetCompMesh(TPZCompMesh *pRef, bool mustOptimizeBandwidth)
{
    // the postprocess mesh already exists, do nothing
    if (fpMainMesh == pRef) {
        return;
    }
    
    if (fCompMesh) {
        delete fCompMesh;
        fCompMesh = 0;
        TPZLinearAnalysis::CleanUp();
    }

    fpMainMesh = pRef;
    
    if (!pRef) {
        return;
    }
    
    TPZCompMesh* pcMainMesh = fpMainMesh;
    
    TPZGeoMesh * pgmesh = pcMainMesh->Reference();

    TPZCompMesh * pcPostProcMesh = new TPZCompMesh(pgmesh);
    
    fCompMesh = pcPostProcMesh;
    
    TPZPostProcAnalysis::SetAllCreateFunctionsPostProc(pcPostProcMesh);
    
}